

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

InlineFrameInfoValue * __thiscall
Memory::AllocateArray<Memory::JitArenaAllocator,InlineFrameInfoValue,false>
          (Memory *this,JitArenaAllocator *allocator,offset_in_JitArenaAllocator_to_subr AllocFunc,
          size_t count)

{
  undefined1 auVar1 [16];
  InlineFrameInfoValue *pIVar2;
  InlineFrameInfoValue *pIVar3;
  size_t byteSize;
  
  if (count == 0) {
    pIVar2 = (InlineFrameInfoValue *)0x8;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = count;
    byteSize = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
      byteSize = SUB168(auVar1 * ZEXT816(0x18),0);
    }
    pIVar2 = (InlineFrameInfoValue *)
             new__<Memory::JitArenaAllocator>
                       (byteSize,(JitArenaAllocator *)this,
                        (offset_in_JitArenaAllocator_to_subr)allocator);
    pIVar3 = pIVar2;
    do {
      pIVar3->type = InlineeFrameInfoValueType_None;
      (pIVar3->field_1).sym = (StackSym *)0x0;
      pIVar3 = pIVar3 + 1;
    } while (pIVar3 != pIVar2 + count);
  }
  return pIVar2;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}